

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunLatePeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValue **ppVVar1;
  bool bVar2;
  VmValueType VVar3;
  VmInstructionType VVar4;
  uint uVar5;
  VmConstant *pVVar6;
  VmValue *pVVar7;
  VmInstruction *pVVar8;
  VmValue *pVVar9;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar5 = value->typeID;
  if (uVar5 != 2) {
    if (uVar5 == 3) {
      pVVar9 = (VmValue *)value[1].comment.end;
      while (pVVar9 != (VmValue *)0x0) {
        pVVar7 = pVVar9[1].users.little[0];
        RunLatePeepholeOptimizations(ctx,module,pVVar9);
        pVVar9 = pVVar7;
      }
      return;
    }
    if (uVar5 != 4) {
      return;
    }
    pVVar9 = (VmValue *)value[1].source;
    while (pVVar9 != (VmValue *)0x0) {
      pVVar7 = (VmValue *)pVVar9[1].comment.begin;
      RunLatePeepholeOptimizations(ctx,module,pVVar9);
      pVVar9 = pVVar7;
    }
    return;
  }
  uVar5 = *(uint *)&value[1]._vptr_VmValue;
  if (uVar5 - 0x26 < 0xd) {
    VVar3 = value[1].type.type;
    if (VVar3 < VM_TYPE_DOUBLE) goto LAB_001a1bab;
    pVVar8 = (VmInstruction *)(*(long **)&value[1].typeID)[1];
    if ((pVVar8 != (VmInstruction *)0x0) && ((pVVar8->super_VmValue).typeID == 2)) {
      switch(*(undefined4 *)(**(long **)&value[1].typeID + 0x10)) {
      case 1:
switchD_001a17cb_caseD_1:
        VVar4 = VM_INST_LOAD_INT;
        break;
      case 2:
        if (pVVar8->cmd != VM_INST_LOAD_DOUBLE) goto switchD_001a17cb_caseD_4;
        goto LAB_001a1854;
      case 3:
      case 6:
switchD_001a17cb_caseD_3:
        VVar4 = VM_INST_LOAD_LONG;
        break;
      default:
        goto switchD_001a17cb_caseD_4;
      }
      if (pVVar8->cmd == VVar4) {
LAB_001a1854:
        if (((VVar3 == VM_TYPE_DOUBLE) && ((pVVar8->super_VmValue).users.count == 1)) &&
           (bVar2 = IsReachableLoadValue((VmInstruction *)value,pVVar8), bVar2)) {
          uVar5 = (pVVar8->arguments).count;
          if ((uVar5 == 0) || (uVar5 == 1)) goto LAB_001a1bab;
          ppVVar1 = (pVVar8->arguments).data;
          pVVar9 = *ppVVar1;
          pVVar7 = ppVVar1[1];
          pVVar6 = CreateConstantInt(ctx->allocator,value->source,pVVar8->cmd);
          VVar4 = anon_unknown.dwarf_107107::GetOperationWithLoad
                            (*(VmInstructionType *)&value[1]._vptr_VmValue);
          if (value[1].type.type == VM_TYPE_VOID) goto LAB_001a1bab;
          anon_unknown.dwarf_107107::ChangeInstructionTo
                    ((VmModule *)module->allocator,(VmInstruction *)value,VVar4,
                     (VmValue *)**(undefined8 **)&value[1].typeID,pVVar9,pVVar7,
                     &pVVar6->super_VmValue,(VmValue *)0x0,&module->peepholeOptimizations);
        }
      }
    }
switchD_001a17cb_caseD_4:
    uVar5 = *(uint *)&value[1]._vptr_VmValue;
  }
  else if (uVar5 - 0x22 < 4) {
    VVar3 = value[1].type.type;
    if (VVar3 < VM_TYPE_DOUBLE) goto LAB_001a1bab;
    pVVar8 = (VmInstruction *)(*(long **)&value[1].typeID)[1];
    if ((pVVar8 != (VmInstruction *)0x0) && ((pVVar8->super_VmValue).typeID == 2)) {
      switch(*(undefined4 *)(**(long **)&value[1].typeID + 0x10)) {
      case 1:
        goto switchD_001a17cb_caseD_1;
      case 2:
        if (pVVar8->cmd - VM_INST_LOAD_FLOAT < 2) goto LAB_001a1854;
        break;
      case 3:
      case 6:
        goto switchD_001a17cb_caseD_3;
      }
    }
    goto switchD_001a17cb_caseD_4;
  }
  if (0x32 < uVar5) {
    return;
  }
  if ((0x7301400000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
    if ((0xf0000000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      return;
    }
    VVar3 = value[1].type.type;
    if (VVar3 == VM_TYPE_VOID) goto LAB_001a1bab;
    pVVar8 = (VmInstruction *)**(undefined8 **)&value[1].typeID;
    if (pVVar8 == (VmInstruction *)0x0) {
      return;
    }
    if ((pVVar8->super_VmValue).typeID != 2) {
      return;
    }
    if (VVar3 == VM_TYPE_INT) goto LAB_001a1bab;
    switch(*(undefined4 *)((*(undefined8 **)&value[1].typeID)[1] + 0x10)) {
    case 1:
      VVar4 = VM_INST_LOAD_INT;
      break;
    case 2:
      if (pVVar8->cmd != VM_INST_LOAD_DOUBLE) {
        return;
      }
      goto LAB_001a1aca;
    case 3:
    case 6:
      VVar4 = VM_INST_LOAD_LONG;
      break;
    default:
      return;
    }
    if (pVVar8->cmd != VVar4) {
      return;
    }
LAB_001a1aca:
    if (VVar3 != VM_TYPE_DOUBLE) {
      return;
    }
    if ((pVVar8->super_VmValue).users.count != 1) {
      return;
    }
    bVar2 = IsReachableLoadValue((VmInstruction *)value,pVVar8);
    if (!bVar2) {
      return;
    }
    uVar5 = (pVVar8->arguments).count;
    if ((uVar5 == 0) || (uVar5 == 1)) goto LAB_001a1bab;
    ppVVar1 = (pVVar8->arguments).data;
    pVVar9 = *ppVVar1;
    pVVar7 = ppVVar1[1];
    pVVar6 = CreateConstantInt(ctx->allocator,value->source,pVVar8->cmd);
    VVar4 = anon_unknown.dwarf_107107::GetMirroredComparisonOperationWithLoad
                      (*(VmInstructionType *)&value[1]._vptr_VmValue);
  }
  else {
    VVar3 = value[1].type.type;
    if (VVar3 == VM_TYPE_VOID) goto LAB_001a1bab;
    pVVar8 = (VmInstruction *)**(undefined8 **)&value[1].typeID;
    if (pVVar8 == (VmInstruction *)0x0) {
      return;
    }
    if ((pVVar8->super_VmValue).typeID != 2) {
      return;
    }
    if (VVar3 == VM_TYPE_INT) goto LAB_001a1bab;
    switch(*(undefined4 *)((*(undefined8 **)&value[1].typeID)[1] + 0x10)) {
    case 1:
      VVar4 = VM_INST_LOAD_INT;
      break;
    case 2:
      if (pVVar8->cmd != VM_INST_LOAD_DOUBLE) {
        return;
      }
      goto LAB_001a1a2b;
    case 3:
    case 6:
      VVar4 = VM_INST_LOAD_LONG;
      break;
    default:
      goto LAB_001a1b87;
    }
    if (pVVar8->cmd != VVar4) {
LAB_001a1b87:
      return;
    }
LAB_001a1a2b:
    if (VVar3 != VM_TYPE_DOUBLE) {
      return;
    }
    if ((pVVar8->super_VmValue).users.count != 1) {
      return;
    }
    bVar2 = IsReachableLoadValue((VmInstruction *)value,pVVar8);
    if (!bVar2) {
      return;
    }
    uVar5 = (pVVar8->arguments).count;
    if ((uVar5 == 0) || (uVar5 == 1)) goto LAB_001a1bab;
    ppVVar1 = (pVVar8->arguments).data;
    pVVar9 = *ppVVar1;
    pVVar7 = ppVVar1[1];
    pVVar6 = CreateConstantInt(ctx->allocator,value->source,pVVar8->cmd);
    VVar4 = anon_unknown.dwarf_107107::GetOperationWithLoad
                      (*(VmInstructionType *)&value[1]._vptr_VmValue);
  }
  if (VM_TYPE_INT < value[1].type.type) {
    anon_unknown.dwarf_107107::ChangeInstructionTo
              ((VmModule *)module->allocator,(VmInstruction *)value,VVar4,
               *(VmValue **)(*(long *)&value[1].typeID + 8),pVVar9,pVVar7,&pVVar6->super_VmValue,
               (VmValue *)0x0,&module->peepholeOptimizations);
    return;
  }
LAB_001a1bab:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,"T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
               );
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}